

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

void __thiscall slang::ast::Symbol::appendHierarchicalPath(Symbol *this,string *result)

{
  char *pcVar1;
  FormatBuffer buffer;
  FormatBuffer local_230;
  
  pcVar1 = local_230.buf.store_;
  local_230.buf.super_buffer<char>.size_ = 0;
  local_230.buf.super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_230.buf.super_buffer<char>.capacity_ = 500;
  local_230.showColors = false;
  local_230.buf.super_buffer<char>.ptr_ = pcVar1;
  getHierarchicalPathImpl(this,&local_230);
  if (local_230.buf.super_buffer<char>.size_ == 0) {
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)&local_230,"$unit","");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (result,local_230.buf.super_buffer<char>.ptr_,local_230.buf.super_buffer<char>.size_);
  if (local_230.buf.super_buffer<char>.ptr_ != pcVar1) {
    free(local_230.buf.super_buffer<char>.ptr_);
  }
  return;
}

Assistant:

void Symbol::appendHierarchicalPath(std::string& result) const {
    FormatBuffer buffer;
    getHierarchicalPathImpl(*this, buffer);
    if (buffer.empty())
        buffer.append("$unit");

    result.append(buffer.data(), buffer.size());
}